

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void cmsys::anon_unknown_3::StacktraceSignalHandler(int sigNo,siginfo_t *sigInfo,void *param_3)

{
  __pid_t _Var1;
  int wholePath;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  string local_1e8 [32];
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream oss;
  void *param_2_local;
  siginfo_t *sigInfo_local;
  int sigNo_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostringstream *)local_198,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"=========================================================");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Process id ");
  _Var1 = getpid();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var1);
  std::operator<<(poVar2," ");
  wholePath = 0xa33354;
  switch(sigNo + -2) {
  case 0:
    std::operator<<((ostream *)local_198,"Caught SIGINT");
    break;
  default:
    wholePath = 0xa33354;
    poVar2 = std::operator<<((ostream *)local_198,"Caught ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sigNo);
    poVar2 = std::operator<<(poVar2," code ");
    std::ostream::operator<<(poVar2,sigInfo->si_code);
    break;
  case 2:
    poVar2 = std::operator<<((ostream *)local_198,"Caught SIGILL at ");
    pcVar4 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar4 = "0x";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(sigInfo->_sifields)._sigfault.si_addr);
    std::operator<<(poVar2," ");
    wholePath = sigInfo->si_code + -1;
    iVar3 = 0xa3338c;
    switch(wholePath) {
    case 0:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"illegal opcode");
      break;
    case 1:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"illegal operand");
      break;
    case 2:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"illegal addressing mode.");
      break;
    case 3:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"illegal trap");
      break;
    case 4:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"privileged opcode");
      break;
    case 5:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"privileged register");
      break;
    case 6:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"co-processor error");
      break;
    case 7:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"internal stack error");
      break;
    default:
      poVar2 = std::operator<<((ostream *)local_198,"code ");
      std::ostream::operator<<(poVar2,sigInfo->si_code);
    }
    break;
  case 4:
    std::operator<<((ostream *)local_198,"Caught SIGABRT");
    break;
  case 5:
    poVar2 = std::operator<<((ostream *)local_198,"Caught SIGBUS at ");
    pcVar4 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar4 = "0x";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(sigInfo->_sifields)._sigfault.si_addr);
    std::operator<<(poVar2," ");
    wholePath = sigInfo->si_code + -1;
    iVar3 = 0xa333ac;
    switch(wholePath) {
    case 0:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"invalid address alignment");
      break;
    case 1:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"nonexistent physical address");
      break;
    case 2:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"object-specific hardware error");
      break;
    case 3:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,
                      "Hardware memory error consumed on a machine check; action required.");
      break;
    case 4:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,
                      "Hardware memory error detected in process but not consumed; action optional."
                     );
      break;
    default:
      poVar2 = std::operator<<((ostream *)local_198,"code ");
      std::ostream::operator<<(poVar2,sigInfo->si_code);
    }
    break;
  case 6:
    poVar2 = std::operator<<((ostream *)local_198,"Caught SIGFPE at ");
    pcVar4 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar4 = "0x";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(sigInfo->_sifields)._sigfault.si_addr);
    std::operator<<(poVar2," ");
    wholePath = sigInfo->si_code + -1;
    iVar3 = 0xa333c0;
    switch(wholePath) {
    case 0:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"integer division by zero");
      break;
    case 1:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"integer overflow");
      break;
    case 2:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point divide by zero");
      break;
    case 3:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point overflow");
      break;
    case 4:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point underflow");
      break;
    case 5:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point inexact result");
      break;
    case 6:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point invalid operation");
      break;
    case 7:
      wholePath = iVar3;
      std::operator<<((ostream *)local_198,"floating point subscript out of range");
      break;
    default:
      poVar2 = std::operator<<((ostream *)local_198,"code ");
      std::ostream::operator<<(poVar2,sigInfo->si_code);
    }
    break;
  case 9:
    poVar2 = std::operator<<((ostream *)local_198,"Caught SIGSEGV at ");
    pcVar4 = "";
    if ((sigInfo->_sifields)._sigfault.si_addr == (void *)0x0) {
      pcVar4 = "0x";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(sigInfo->_sifields)._sigfault.si_addr);
    std::operator<<(poVar2," ");
    if (sigInfo->si_code == 1) {
      std::operator<<((ostream *)local_198,"address not mapped to object");
    }
    else if (sigInfo->si_code == 2) {
      std::operator<<((ostream *)local_198,"invalid permission for mapped object");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_198,"code ");
      std::ostream::operator<<(poVar2,sigInfo->si_code);
    }
    break;
  case 0xd:
    std::operator<<((ostream *)local_198,"Caught SIGTERM");
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Program Stack:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  SystemInformationImplementation::GetProgramStack_abi_cxx11_
            (&local_1c8,(SystemInformationImplementation *)0x2,0,wholePath);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2,"=========================================================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cerr,local_1e8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e8);
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
}

Assistant:

void StacktraceSignalHandler(int sigNo, siginfo_t* sigInfo,
                             void* /*sigContext*/)
{
#if defined(__linux) || defined(__APPLE__)
  std::ostringstream oss;
  oss << std::endl
      << "========================================================="
      << std::endl
      << "Process id " << getpid() << " ";
  switch (sigNo) {
    case SIGINT:
      oss << "Caught SIGINT";
      break;

    case SIGTERM:
      oss << "Caught SIGTERM";
      break;

    case SIGABRT:
      oss << "Caught SIGABRT";
      break;

    case SIGFPE:
      oss << "Caught SIGFPE at " << (sigInfo->si_addr == 0 ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
#if defined(FPE_INTDIV)
        case FPE_INTDIV:
          oss << "integer division by zero";
          break;
#endif

#if defined(FPE_INTOVF)
        case FPE_INTOVF:
          oss << "integer overflow";
          break;
#endif

        case FPE_FLTDIV:
          oss << "floating point divide by zero";
          break;

        case FPE_FLTOVF:
          oss << "floating point overflow";
          break;

        case FPE_FLTUND:
          oss << "floating point underflow";
          break;

        case FPE_FLTRES:
          oss << "floating point inexact result";
          break;

        case FPE_FLTINV:
          oss << "floating point invalid operation";
          break;

#if defined(FPE_FLTSUB)
        case FPE_FLTSUB:
          oss << "floating point subscript out of range";
          break;
#endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGSEGV:
      oss << "Caught SIGSEGV at " << (sigInfo->si_addr == 0 ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case SEGV_MAPERR:
          oss << "address not mapped to object";
          break;

        case SEGV_ACCERR:
          oss << "invalid permission for mapped object";
          break;

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGBUS:
      oss << "Caught SIGBUS at " << (sigInfo->si_addr == 0 ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case BUS_ADRALN:
          oss << "invalid address alignment";
          break;

#if defined(BUS_ADRERR)
        case BUS_ADRERR:
          oss << "nonexistent physical address";
          break;
#endif

#if defined(BUS_OBJERR)
        case BUS_OBJERR:
          oss << "object-specific hardware error";
          break;
#endif

#if defined(BUS_MCEERR_AR)
        case BUS_MCEERR_AR:
          oss << "Hardware memory error consumed on a machine check; action "
                 "required.";
          break;
#endif

#if defined(BUS_MCEERR_AO)
        case BUS_MCEERR_AO:
          oss << "Hardware memory error detected in process but not consumed; "
                 "action optional.";
          break;
#endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGILL:
      oss << "Caught SIGILL at " << (sigInfo->si_addr == 0 ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case ILL_ILLOPC:
          oss << "illegal opcode";
          break;

#if defined(ILL_ILLOPN)
        case ILL_ILLOPN:
          oss << "illegal operand";
          break;
#endif

#if defined(ILL_ILLADR)
        case ILL_ILLADR:
          oss << "illegal addressing mode.";
          break;
#endif

        case ILL_ILLTRP:
          oss << "illegal trap";
          break;

        case ILL_PRVOPC:
          oss << "privileged opcode";
          break;

#if defined(ILL_PRVREG)
        case ILL_PRVREG:
          oss << "privileged register";
          break;
#endif

#if defined(ILL_COPROC)
        case ILL_COPROC:
          oss << "co-processor error";
          break;
#endif

#if defined(ILL_BADSTK)
        case ILL_BADSTK:
          oss << "internal stack error";
          break;
#endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    default:
      oss << "Caught " << sigNo << " code " << sigInfo->si_code;
      break;
  }
  oss << std::endl
      << "Program Stack:" << std::endl
      << SystemInformationImplementation::GetProgramStack(2, 0)
      << "========================================================="
      << std::endl;
  std::cerr << oss.str() << std::endl;

  // restore the previously registered handlers
  // and abort
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
#else
  // avoid warning C4100
  (void)sigNo;
  (void)sigInfo;
#endif
}